

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

bool __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
::test_deleted(sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *this,size_type bucknum)

{
  const_reference ppVar1;
  sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *this_00;
  ulong uVar2;
  bool bVar3;
  
  if (this->num_deleted != 0) {
    uVar2 = bucknum % 0x30;
    this_00 = (this->table).groups.
              super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + bucknum / 0x30;
    if ((this_00->bitmap[uVar2 >> 3] >> ((uint)uVar2 & 7) & 1) == 0) {
      bVar3 = false;
    }
    else {
      ppVar1 = sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               ::unsafe_get(this_00,(size_type_conflict)uVar2);
      bVar3 = (this->key_info).delkey.i_ == (ppVar1->first).i_;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool test_deleted(size_type bucknum) const {
    // Invariant: !use_deleted() implies num_deleted is 0.
    assert(settings.use_deleted() || num_deleted == 0);
    return num_deleted > 0 && table.test(bucknum) &&
           test_deleted_key(get_key(table.unsafe_get(bucknum)));
  }